

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int wait_frame_inner(amqp_connection_state_t state,amqp_frame_t *decoded_frame,
                    amqp_time_t timeout_deadline)

{
  int iVar1;
  amqp_time_t aVar2;
  amqp_frame_t heartbeat;
  amqp_frame_t local_60;
  
  do {
    while (state->sock_inbound_offset < state->sock_inbound_limit) {
      iVar1 = consume_one_frame(state,decoded_frame);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (decoded_frame->frame_type != '\0') {
        if (decoded_frame->frame_type != '\b') {
          return 0;
        }
        amqp_maybe_release_buffers_on_channel(state,0);
      }
    }
    while( true ) {
      iVar1 = amqp_time_has_past((amqp_time_t)(state->next_send_heartbeat).time_point_ns);
      if (iVar1 == -0xd) {
        local_60.channel = 0;
        local_60.frame_type = '\b';
        iVar1 = amqp_send_frame(state,&local_60);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else if (iVar1 == -0xe) {
        return -0xe;
      }
      aVar2 = amqp_time_first((state->next_recv_heartbeat).time_point_ns,
                              (state->next_send_heartbeat).time_point_ns);
      aVar2 = amqp_time_first(timeout_deadline,aVar2);
      iVar1 = recv_with_timeout(state,aVar2);
      if (iVar1 != -0xd) break;
      iVar1 = amqp_time_equal(aVar2,(amqp_time_t)(state->next_recv_heartbeat).time_point_ns);
      if (iVar1 != 0) {
        (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
        return -0xf;
      }
      iVar1 = amqp_time_equal(aVar2,timeout_deadline);
      if (iVar1 != 0) {
        return -0xd;
      }
      iVar1 = amqp_time_equal(aVar2,(amqp_time_t)(state->next_send_heartbeat).time_point_ns);
      if (iVar1 == 0) {
        amqp_abort("Internal error: unable to determine timeout reason");
      }
    }
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static int wait_frame_inner(amqp_connection_state_t state,
                            amqp_frame_t *decoded_frame,
                            amqp_time_t timeout_deadline) {
  amqp_time_t deadline;
  int res;

  for (;;) {
    while (amqp_data_in_buffer(state)) {
      res = consume_one_frame(state, decoded_frame);

      if (AMQP_STATUS_OK != res) {
        return res;
      }

      if (AMQP_FRAME_HEARTBEAT == decoded_frame->frame_type) {
        amqp_maybe_release_buffers_on_channel(state, 0);
        continue;
      }

      if (decoded_frame->frame_type != 0) {
        /* Complete frame was read. Return it. */
        return AMQP_STATUS_OK;
      }
    }

  beginrecv:
    res = amqp_time_has_past(state->next_send_heartbeat);
    if (AMQP_STATUS_TIMER_FAILURE == res) {
      return res;
    } else if (AMQP_STATUS_TIMEOUT == res) {
      amqp_frame_t heartbeat;
      heartbeat.channel = 0;
      heartbeat.frame_type = AMQP_FRAME_HEARTBEAT;

      res = amqp_send_frame(state, &heartbeat);
      if (AMQP_STATUS_OK != res) {
        return res;
      }
    }
    deadline = amqp_time_first(timeout_deadline,
                               amqp_time_first(state->next_recv_heartbeat,
                                               state->next_send_heartbeat));

    /* TODO this needs to wait for a _frame_ and not anything written from the
     * socket */
    res = recv_with_timeout(state, deadline);

    if (AMQP_STATUS_TIMEOUT == res) {
      if (amqp_time_equal(deadline, state->next_recv_heartbeat)) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
        return AMQP_STATUS_HEARTBEAT_TIMEOUT;
      } else if (amqp_time_equal(deadline, timeout_deadline)) {
        return AMQP_STATUS_TIMEOUT;
      } else if (amqp_time_equal(deadline, state->next_send_heartbeat)) {
        /* send heartbeat happens before we do recv_with_timeout */
        goto beginrecv;
      } else {
        amqp_abort("Internal error: unable to determine timeout reason");
      }
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }
  }
}